

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

size_t Curl_hash_str(void *key,size_t key_length,size_t slots_num)

{
  ulong uVar1;
  char *pcVar2;
  
  pcVar2 = (char *)(key_length + (long)key);
  uVar1 = 0x1505;
  for (; key < pcVar2; key = (void *)((long)key + 1)) {
    uVar1 = uVar1 * 0x21 ^ (long)*key;
  }
  return uVar1 % slots_num;
}

Assistant:

size_t Curl_hash_str(void *key, size_t key_length, size_t slots_num)
{
  const char *key_str = (const char *) key;
  const char *end = key_str + key_length;
  size_t h = 5381;

  while(key_str < end) {
    size_t j = (size_t)*key_str++;
    h += h << 5;
    h ^= j;
  }

  return (h % slots_num);
}